

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O0

void build_smooth_interintra_mask
               (uint8_t *mask,int stride,BLOCK_SIZE plane_bsize,INTERINTRA_MODE mode)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined1 in_CL;
  byte in_DL;
  int in_ESI;
  void *in_RDI;
  int size_scale;
  int bh;
  int bw;
  int j;
  int i;
  int local_34;
  int local_18;
  int local_14;
  void *local_8;
  
  uVar1 = (uint)block_size_wide[in_DL];
  uVar2 = (uint)block_size_high[in_DL];
  uVar3 = (uint)ii_size_scales[in_DL];
  local_8 = in_RDI;
  switch(in_CL) {
  case 0:
  default:
    for (local_14 = 0; local_14 < (int)uVar2; local_14 = local_14 + 1) {
      memset(local_8,0x20,(long)(int)uVar1);
      local_8 = (void *)((long)local_8 + (long)in_ESI);
    }
    break;
  case 1:
    for (local_14 = 0; local_14 < (int)uVar2; local_14 = local_14 + 1) {
      memset(local_8,(uint)"<:86420/-,*)\'&%#\"! \x1f\x1e\x1d\x1c\x1b\x1a\x19\x18\x17\x16\x16\x15\x14\x13\x13\x12\x12\x11\x10\x10\x0f\x0f\x0e\x0e\r\r\f\f\f\v\v\n\n\n\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x06\x05\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                           [(int)(local_14 * uVar3)],(long)(int)uVar1);
      local_8 = (void *)((long)local_8 + (long)in_ESI);
    }
    break;
  case 2:
    for (local_14 = 0; local_14 < (int)uVar2; local_14 = local_14 + 1) {
      for (local_18 = 0; local_18 < (int)uVar1; local_18 = local_18 + 1) {
        *(uint8_t *)((long)local_8 + (long)local_18) =
             "<:86420/-,*)\'&%#\"! \x1f\x1e\x1d\x1c\x1b\x1a\x19\x18\x17\x16\x16\x15\x14\x13\x13\x12\x12\x11\x10\x10\x0f\x0f\x0e\x0e\r\r\f\f\f\v\v\n\n\n\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x06\x05\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
             [(int)(local_18 * uVar3)];
      }
      local_8 = (void *)((long)local_8 + (long)in_ESI);
    }
    break;
  case 3:
    for (local_14 = 0; local_14 < (int)uVar2; local_14 = local_14 + 1) {
      for (local_18 = 0; local_18 < (int)uVar1; local_18 = local_18 + 1) {
        if (local_14 < local_18) {
          local_34 = local_14;
        }
        else {
          local_34 = local_18;
        }
        *(uint8_t *)((long)local_8 + (long)local_18) =
             "<:86420/-,*)\'&%#\"! \x1f\x1e\x1d\x1c\x1b\x1a\x19\x18\x17\x16\x16\x15\x14\x13\x13\x12\x12\x11\x10\x10\x0f\x0f\x0e\x0e\r\r\f\f\f\v\v\n\n\n\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x06\x05\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
             [(int)(local_34 * uVar3)];
      }
      local_8 = (void *)((long)local_8 + (long)in_ESI);
    }
  }
  return;
}

Assistant:

static inline void build_smooth_interintra_mask(uint8_t *mask, int stride,
                                                BLOCK_SIZE plane_bsize,
                                                INTERINTRA_MODE mode) {
  int i, j;
  const int bw = block_size_wide[plane_bsize];
  const int bh = block_size_high[plane_bsize];
  const int size_scale = ii_size_scales[plane_bsize];

  switch (mode) {
    case II_V_PRED:
      for (i = 0; i < bh; ++i) {
        memset(mask, ii_weights1d[i * size_scale], bw * sizeof(mask[0]));
        mask += stride;
      }
      break;

    case II_H_PRED:
      for (i = 0; i < bh; ++i) {
        for (j = 0; j < bw; ++j) mask[j] = ii_weights1d[j * size_scale];
        mask += stride;
      }
      break;

    case II_SMOOTH_PRED:
      for (i = 0; i < bh; ++i) {
        for (j = 0; j < bw; ++j)
          mask[j] = ii_weights1d[(i < j ? i : j) * size_scale];
        mask += stride;
      }
      break;

    case II_DC_PRED:
    default:
      for (i = 0; i < bh; ++i) {
        memset(mask, 32, bw * sizeof(mask[0]));
        mask += stride;
      }
      break;
  }
}